

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

optional<unsigned_int> convert_gram(IndexType type,int index,QString *string)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<QToken,_std::allocator<QToken>_> *in_RDX;
  int in_ESI;
  int i;
  uint64_t source;
  int size;
  uint64_t in_stack_00000060;
  IndexType in_stack_0000006c;
  int local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  _Optional_payload_base<unsigned_int> local_8;
  
  sVar2 = get_ngram_size_for((IndexType)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  sVar3 = std::vector<QToken,_std::allocator<QToken>_>::size(in_RDX);
  if (sVar3 < (ulong)(long)(in_ESI + (int)sVar2)) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
  }
  else {
    for (local_2c = 0; local_2c < (int)sVar2; local_2c = local_2c + 1) {
      std::vector<QToken,_std::allocator<QToken>_>::operator[](in_RDX,(long)(in_ESI + local_2c));
      bVar1 = QToken::unique((QToken *)0x1b45df);
      if (!bVar1) {
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
        return (optional<unsigned_int>)local_8;
      }
      this = std::vector<QToken,_std::allocator<QToken>_>::operator[]
                       (in_RDX,(long)(in_ESI + local_2c));
      this_00 = QToken::possible_values(this);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
    }
    local_8 = (_Optional_payload_base<unsigned_int>)
              convert_gram(in_stack_0000006c,in_stack_00000060);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, int index,
                                    const QString &string) {
    int size = get_ngram_size_for(type);
    if (index + size > string.size()) {
        return std::nullopt;
    }
    uint64_t source = 0;
    for (int i = 0; i < size; i++) {
        if (!string[index + i].unique()) {
            return std::nullopt;
        }
        source = (source << 8) | string[index + i].possible_values()[0];
    }
    return convert_gram(type, source);
}